

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catalogManager.cpp
# Opt level: O0

bool __thiscall catalog::createIndex(catalog *this,IndexInfo *indexinfo)

{
  value_type pTVar1;
  bool bVar2;
  __type _Var3;
  reference ppTVar4;
  pointer ppVar5;
  ostream *poVar6;
  pointer ppVar7;
  reference pvVar8;
  undefined1 local_90 [8];
  pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> p;
  _Self local_60;
  iterator x;
  _Self local_50;
  iterator it;
  _Self local_40;
  _Base_ptr local_38;
  _Rb_tree_iterator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_30;
  iterator it_1;
  int i;
  int pos;
  IndexInfo *indexinfo_local;
  catalog *this_local;
  
  it_1._M_node._4_4_ = -1;
  it_1._M_node._0_4_ = 0;
  do {
    if (this->tableNumber <= (int)it_1._M_node) {
      if (it_1._M_node._4_4_ == -1) {
        poVar6 = std::operator<<((ostream *)&std::cout,"can not find table in list");
        std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
        this_local._7_1_ = false;
      }
      else {
        poVar6 = std::operator<<((ostream *)&std::cout,"i find table in list");
        std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
        ppTVar4 = std::vector<TableInfo_*,_std::allocator<TableInfo_*>_>::operator[]
                            (&this->TableInfoList,(long)it_1._M_node._4_4_);
        local_50._M_node =
             (_Base_ptr)
             std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
             ::find(&(*ppTVar4)->getID,&indexinfo->colunmName);
        ppTVar4 = std::vector<TableInfo_*,_std::allocator<TableInfo_*>_>::operator[]
                            (&this->TableInfoList,(long)it_1._M_node._4_4_);
        x._M_node = (_Base_ptr)
                    std::
                    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                    ::end(&(*ppTVar4)->getID);
        bVar2 = std::operator!=(&local_50,(_Self *)&x);
        if (bVar2) {
          ppTVar4 = std::vector<TableInfo_*,_std::allocator<TableInfo_*>_>::operator[]
                              (&this->TableInfoList,(long)it_1._M_node._4_4_);
          pTVar1 = *ppTVar4;
          ppVar7 = std::
                   _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>
                   ::operator->(&local_50);
          local_60._M_node =
               (_Base_ptr)
               std::
               map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::find(&pTVar1->indexInfo,&ppVar7->second);
          ppTVar4 = std::vector<TableInfo_*,_std::allocator<TableInfo_*>_>::operator[]
                              (&this->TableInfoList,(long)it_1._M_node._4_4_);
          p._32_8_ = std::
                     map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     ::end(&(*ppTVar4)->indexInfo);
          bVar2 = std::operator!=(&local_60,(_Self *)&p.field_0x20);
          if (bVar2) {
            poVar6 = std::operator<<((ostream *)&std::cout,"index already exists in ");
            ppTVar4 = std::vector<TableInfo_*,_std::allocator<TableInfo_*>_>::operator[]
                                (&this->TableInfoList,(long)it_1._M_node._4_4_);
            poVar6 = std::operator<<(poVar6,(string *)*ppTVar4);
            std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
            this_local._7_1_ = false;
          }
          else {
            ppTVar4 = std::vector<TableInfo_*,_std::allocator<TableInfo_*>_>::operator[]
                                (&this->TableInfoList,(long)it_1._M_node._4_4_);
            pTVar1 = *ppTVar4;
            ppVar7 = std::
                     _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>
                     ::operator->(&local_50);
            pvVar8 = std::vector<int,_std::allocator<int>_>::operator[]
                               (&pTVar1->constraint,(long)ppVar7->second);
            *pvVar8 = 4;
            ppVar7 = std::
                     _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>
                     ::operator->(&local_50);
            std::make_pair<int&,std::__cxx11::string&>
                      ((pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)local_90,&ppVar7->second,&indexinfo->indexName);
            ppTVar4 = std::vector<TableInfo_*,_std::allocator<TableInfo_*>_>::operator[]
                                (&this->TableInfoList,(long)it_1._M_node._4_4_);
            std::
            map<int,std::__cxx11::string,std::less<int>,std::allocator<std::pair<int_const,std::__cxx11::string>>>
            ::insert<std::pair<int,std::__cxx11::string>&>
                      ((map<int,std::__cxx11::string,std::less<int>,std::allocator<std::pair<int_const,std::__cxx11::string>>>
                        *)&(*ppTVar4)->indexInfo,
                       (pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)local_90);
            poVar6 = std::operator<<((ostream *)&std::cout,"create index ");
            poVar6 = std::operator<<(poVar6,(string *)&indexinfo->indexName);
            std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
            if ((this->anychangeornot & 1U) == 0) {
              this->anychangeornot = true;
            }
            this_local._7_1_ = true;
            std::
            pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::~pair((pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)local_90);
          }
        }
        else {
          poVar6 = std::operator<<((ostream *)&std::cout,"can not find colunm ");
          poVar6 = std::operator<<(poVar6,(string *)&indexinfo->colunmName);
          poVar6 = std::operator<<(poVar6," in list");
          std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
          this_local._7_1_ = false;
        }
      }
      return this_local._7_1_;
    }
    std::
    _Rb_tree_iterator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::_Rb_tree_iterator(&local_30);
    ppTVar4 = std::vector<TableInfo_*,_std::allocator<TableInfo_*>_>::operator[]
                        (&this->TableInfoList,(long)(int)it_1._M_node);
    local_38 = (_Base_ptr)
               std::
               map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::begin(&(*ppTVar4)->indexInfo);
    local_30._M_node = local_38;
    while( true ) {
      ppTVar4 = std::vector<TableInfo_*,_std::allocator<TableInfo_*>_>::operator[]
                          (&this->TableInfoList,(long)(int)it_1._M_node);
      local_40._M_node =
           (_Base_ptr)
           std::
           map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::end(&(*ppTVar4)->indexInfo);
      bVar2 = std::operator!=(&local_30,&local_40);
      if (!bVar2) break;
      ppVar5 = std::
               _Rb_tree_iterator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator->(&local_30);
      _Var3 = std::operator==(&indexinfo->indexName,&ppVar5->second);
      if (_Var3) {
        poVar6 = std::operator<<((ostream *)&std::cout,"index ");
        poVar6 = std::operator<<(poVar6,(string *)&indexinfo->indexName);
        poVar6 = std::operator<<(poVar6," already exists in ");
        ppTVar4 = std::vector<TableInfo_*,_std::allocator<TableInfo_*>_>::operator[]
                            (&this->TableInfoList,(long)(int)it_1._M_node);
        poVar6 = std::operator<<(poVar6,(string *)*ppTVar4);
        std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
        return false;
      }
      it._M_node = (_Base_ptr)
                   std::
                   _Rb_tree_iterator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::operator++(&local_30,0);
    }
    ppTVar4 = std::vector<TableInfo_*,_std::allocator<TableInfo_*>_>::operator[]
                        (&this->TableInfoList,(long)(int)it_1._M_node);
    _Var3 = std::operator==(&(*ppTVar4)->tableName,&indexinfo->tableName);
    if (_Var3) {
      it_1._M_node._4_4_ = (int)it_1._M_node;
    }
    it_1._M_node._0_4_ = (int)it_1._M_node + 1;
  } while( true );
}

Assistant:

bool catalog::createIndex(IndexInfo *indexinfo){
    int pos = -1;
    for(int i = 0 ; i < tableNumber ; i ++){
        std::map<int,std::string>::iterator it;
        it = TableInfoList[i]->indexInfo.begin();
        while(it != TableInfoList[i]->indexInfo.end())
        {
            //检查每个表上indexName是否被占用
            // std::cout << it->second <<std::endl;
            // if(indexinfo->indexID == TableInfoList[])
            if(indexinfo->indexName == it->second){
                 std::cout<<"index "<<indexinfo->indexName <<" already exists in "<<TableInfoList[i]->tableName<<std::endl;
                 return false;
            }
            it ++;         
        }
        //
        if(TableInfoList[i]->tableName == indexinfo->tableName){
            pos = i;
        }
    }

    //
    if(pos == -1){
        std::cout<<"can not find table in list"<<std::endl;
        return false;
    }
    std::cout<<"i find table in list"<<std::endl;
    auto it = TableInfoList[pos]->getID.find(indexinfo->colunmName);
    if(it!=TableInfoList[pos]->getID.end()){
        //这个列名存在
        auto x = TableInfoList[pos]->indexInfo.find(it->second);
        if(x!=TableInfoList[pos]->indexInfo.end()){
            //这个列已经被建立索引
            std::cout<<"index already exists in "<<TableInfoList[pos]->tableName<<std::endl;
            return false;
        }

    }else{
        std::cout<<"can not find colunm "<<indexinfo->colunmName <<" in list"<<std::endl;
        return false;
    }
    //先修改constraint
    TableInfoList[pos]->constraint[it->second] = 4;
    //修改indexInfo
    std::pair<int,std::string> p = std::make_pair(it->second, indexinfo->indexName);      
    TableInfoList[pos]->indexInfo.insert(p);
    std::cout<<"create index "<<indexinfo->indexName<<std::endl;
    if(!anychangeornot)anychangeornot = true;
    return true;
}